

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  ReservedChars RVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  bool bVar8;
  
  pbVar1 = (byte *)this->cursor_;
  bVar8 = false;
  lVar3 = 0;
  pbVar4 = pbVar1;
  do {
    uVar7 = 0xffffffff;
    pbVar5 = pbVar4;
    if (pbVar4 < this->buffer_end_) {
      pbVar5 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar7 = (uint)*pbVar4;
    }
    if (uVar7 != (int)"nan"[lVar3]) {
      this->cursor_ = (char *)pbVar1;
      break;
    }
    lVar3 = lVar3 + 1;
    bVar8 = lVar3 == 3;
    pbVar4 = pbVar5;
  } while (!bVar8);
  if (bVar8) {
    pbVar1 = (byte *)this->buffer_end_;
    pbVar4 = (byte *)this->cursor_;
    if (pbVar4 < pbVar1) {
      bVar8 = *pbVar4 == 0x3a;
    }
    else {
      bVar8 = false;
    }
    if (bVar8 && pbVar4 < pbVar1) {
      this->cursor_ = (char *)(pbVar4 + 1);
    }
    if (bVar8) {
      pbVar4 = (byte *)this->cursor_;
      bVar8 = false;
      lVar3 = 0;
      pbVar5 = pbVar4;
      do {
        uVar7 = 0xffffffff;
        pbVar6 = pbVar5;
        if (pbVar5 < pbVar1) {
          pbVar6 = pbVar5 + 1;
          this->cursor_ = (char *)pbVar6;
          uVar7 = (uint)*pbVar5;
        }
        if (uVar7 != (int)", 0x"[lVar3 + 2]) {
          this->cursor_ = (char *)pbVar4;
          break;
        }
        lVar3 = lVar3 + 1;
        bVar8 = lVar3 == 2;
        pbVar5 = pbVar6;
      } while (!bVar8);
      if ((!bVar8) || (bVar8 = ReadHexNum(this), !bVar8)) goto LAB_0019102e;
    }
    RVar2 = ReadReservedChars(this);
    if (RVar2 == None) {
      LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
      return __return_storage_ptr__;
    }
  }
LAB_0019102e:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}